

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

void __thiscall
TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>::Resize
          (TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>
           *this,hash_t nhsize)

{
  Node *pNVar1;
  undefined6 uVar2;
  bool bVar3;
  FName local_34;
  Node *local_30;
  Node *n;
  Node *nold;
  uint local_18;
  hash_t oldhsize;
  hash_t i;
  hash_t nhsize_local;
  TMap<FName,_DamageTypeDefinition,_THashTraits<FName>,_TValueTraits<DamageTypeDefinition>_>
  *this_local;
  
  nold._4_4_ = this->Size;
  n = this->Nodes;
  oldhsize = nhsize;
  _i = this;
  SetNodeVector(this,nhsize);
  this->NumUsed = 0;
  for (local_18 = 0; local_18 < nold._4_4_; local_18 = local_18 + 1) {
    bVar3 = Node::IsNil(n + local_18);
    if (!bVar3) {
      FName::FName(&local_34,&n[local_18].Pair.Key);
      local_30 = NewKey(this,&local_34);
      (local_30->Pair).Value.DefaultFactor = n[local_18].Pair.Value.DefaultFactor;
      pNVar1 = n + local_18;
      bVar3 = (pNVar1->Pair).Value.NoArmor;
      uVar2 = *(undefined6 *)&(pNVar1->Pair).Value.field_0xa;
      (local_30->Pair).Value.ReplaceFactor = (pNVar1->Pair).Value.ReplaceFactor;
      (local_30->Pair).Value.NoArmor = bVar3;
      *(undefined6 *)&(local_30->Pair).Value.field_0xa = uVar2;
    }
  }
  M_Free(n);
  return;
}

Assistant:

void Resize(hash_t nhsize)
	{
		hash_t i, oldhsize = Size;
		Node *nold = Nodes;
		/* create new hash part with appropriate size */
		SetNodeVector(nhsize);
		/* re-insert elements from hash part */
		NumUsed = 0;
		for (i = 0; i < oldhsize; ++i)
		{
			if (!nold[i].IsNil())
			{
				Node *n = NewKey(nold[i].Pair.Key);
				::new(&n->Pair.Value) VT(nold[i].Pair.Value);
				nold[i].~Node();
			}
		}
		M_Free(nold);
	}